

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::InputScalarAsWidgetReplacement
               (ImRect *bb,ImGuiID id,char *label,ImGuiDataType data_type,void *data_ptr,
               char *format)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow *window_00;
  ImGuiID in_ESI;
  bool value_changed;
  ImGuiInputTextFlags flags;
  char data_buf [32];
  char fmt_buf [32];
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiInputTextCallback in_stack_000004c0;
  ImGuiInputTextFlags in_stack_000004cc;
  ImVec2 *in_stack_000004d0;
  int in_stack_000004dc;
  char *in_stack_000004e0;
  char *in_stack_000004e8;
  void *in_stack_00000500;
  ImRect *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  undefined8 in_stack_ffffffffffffff68;
  int buf_size;
  undefined4 in_stack_ffffffffffffff70;
  uint uVar3;
  undefined4 in_stack_ffffffffffffff74;
  char *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff88;
  void *in_stack_ffffffffffffff90;
  ImGuiDataType in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  bool local_1;
  
  pIVar1 = GImGui;
  buf_size = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  window_00 = GetCurrentWindow();
  SetActiveID(pIVar1->ScalarAsInputTextId,window_00);
  SetHoveredID(0);
  pIVar1->ActiveIdAllowNavDirFlags = 0xc;
  ImParseFormatTrimDecorations
            (in_stack_ffffffffffffff78,
             (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),buf_size);
  DataTypeFormatString
            (in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
             (ImGuiDataType)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(char *)0x17ccde);
  ImStrTrimBlanks((char *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  ImRect::GetSize(in_stack_ffffffffffffff48);
  bVar2 = InputTextEx(in_stack_000004e8,in_stack_000004e0,in_stack_000004dc,in_stack_000004d0,
                      in_stack_000004cc,in_stack_000004c0,in_stack_00000500);
  uVar3 = (uint)bVar2 << 0x18;
  if (pIVar1->ScalarAsInputTextId == 0) {
    pIVar1->ScalarAsInputTextId = pIVar1->ActiveId;
    SetHoveredID(in_ESI);
  }
  if ((uVar3 & 0x1000000) == 0) {
    local_1 = false;
  }
  else {
    local_1 = DataTypeApplyOpFromText
                        (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                         in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90,
                         in_stack_ffffffffffffff88);
  }
  return local_1;
}

Assistant:

bool ImGui::InputScalarAsWidgetReplacement(const ImRect& bb, ImGuiID id, const char* label, ImGuiDataType data_type, void* data_ptr, const char* format)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    // Our replacement widget will override the focus ID (registered previously to allow for a TAB focus to happen)
    // On the first frame, g.ScalarAsInputTextId == 0, then on subsequent frames it becomes == id
    SetActiveID(g.ScalarAsInputTextId, window);
    SetHoveredID(0);
    g.ActiveIdAllowNavDirFlags = (1 << ImGuiDir_Up) | (1 << ImGuiDir_Down);

    char fmt_buf[32];
    char data_buf[32];
    format = ImParseFormatTrimDecorations(format, fmt_buf, IM_ARRAYSIZE(fmt_buf));
    DataTypeFormatString(data_buf, IM_ARRAYSIZE(data_buf), data_type, data_ptr, format);
    ImStrTrimBlanks(data_buf);
    ImGuiInputTextFlags flags = ImGuiInputTextFlags_AutoSelectAll | ((data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double) ? ImGuiInputTextFlags_CharsScientific : ImGuiInputTextFlags_CharsDecimal);
    bool value_changed = InputTextEx(label, data_buf, IM_ARRAYSIZE(data_buf), bb.GetSize(), flags);
    if (g.ScalarAsInputTextId == 0)     // First frame we started displaying the InputText widget
    {
        IM_ASSERT(g.ActiveId == id);    // InputText ID expected to match the Slider ID
        g.ScalarAsInputTextId = g.ActiveId;
        SetHoveredID(id);
    }
    if (value_changed)
        return DataTypeApplyOpFromText(data_buf, g.InputTextState.InitialText.Data, data_type, data_ptr, NULL);
    return false;
}